

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListShiftJoinType(Parse *pParse,SrcList *p)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  u8 allFlags;
  int i;
  SrcList *p_local;
  Parse *pParse_local;
  
  if ((p != (SrcList *)0x0) && (1 < p->nSrc)) {
    i = p->nSrc + -1;
    allFlags = '\0';
    do {
      bVar1 = p->a[i + -1].fg.jointype;
      p->a[i].fg.jointype = bVar1;
      allFlags = allFlags | bVar1;
      i = i + -1;
    } while (0 < i);
    p->a[0].fg.jointype = '\0';
    if ((allFlags & 0x10) != 0) {
      i = p->nSrc;
      do {
        iVar2 = i;
        i = iVar2 + -1;
        bVar3 = false;
        if (0 < i) {
          bVar3 = (p->a[i].fg.jointype & 0x10) == 0;
        }
      } while (bVar3);
      i = iVar2 + -2;
      do {
        p->a[i].fg.jointype = p->a[i].fg.jointype | 0x40;
        i = i + -1;
      } while (-1 < i);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListShiftJoinType(Parse *pParse, SrcList *p){
  (void)pParse;
  if( p && p->nSrc>1 ){
    int i = p->nSrc-1;
    u8 allFlags = 0;
    do{
      allFlags |= p->a[i].fg.jointype = p->a[i-1].fg.jointype;
    }while( (--i)>0 );
    p->a[0].fg.jointype = 0;

    /* All terms to the left of a RIGHT JOIN should be tagged with the
    ** JT_LTORJ flags */
    if( allFlags & JT_RIGHT ){
      for(i=p->nSrc-1; ALWAYS(i>0) && (p->a[i].fg.jointype&JT_RIGHT)==0; i--){}
      i--;
      assert( i>=0 );
      do{
        p->a[i].fg.jointype |= JT_LTORJ;
      }while( (--i)>=0 );
    }
  }
}